

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall compiler::CompilerAstWalker::loadVariable(CompilerAstWalker *this,string *str)

{
  element_type *peVar1;
  pointer pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  __type _Var8;
  size_t sVar9;
  ByteCodeInstruction instruction;
  long lVar10;
  pointer __lhs;
  undefined1 local_88 [8];
  ClosureContext cc;
  size_t index;
  size_t index_1;
  undefined1 local_40 [8];
  shared_ptr<compiler::EmissionContext> ec;
  
  bVar7 = EmissionContext::GetDeclarationIndex
                    ((this->ec).
                     super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,str,&cc.localScopeIndex,false);
  if (bVar7) {
    instruction = LoadLocal;
    sVar9 = cc.localScopeIndex;
LAB_0011f242:
    emit(this,instruction,sVar9);
  }
  else {
    peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pCVar2 = (peVar1->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = 0;
    for (__lhs = (peVar1->closures).
                 super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pCVar2; __lhs = __lhs + 1) {
      _Var8 = std::operator==(&__lhs->value,str);
      if (_Var8) {
        instruction = LoadClosure;
        goto LAB_0011f242;
      }
      sVar9 = sVar9 + 1;
    }
    index_1 = (size_t)this;
    std::__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               &(((this->ec).
                  super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->outerContext).
                super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>);
    lVar10 = 1;
    while( true ) {
      auVar6 = local_40;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,
                 "Emission context was nullptr when we expected one in resolving closure",
                 (allocator<char> *)&index);
      Error::assertWithPanic(auVar6 != (undefined1  [8])0x0,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      bVar7 = EmissionContext::GetDeclarationIndex((EmissionContext *)local_40,str,&index,true);
      if (bVar7) break;
      std::__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                 (__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_40 + 0x68));
      lVar10 = lVar10 + 1;
    }
    local_88 = (undefined1  [8])&cc.value._M_string_length;
    cc.value._M_dataplus._M_p = (pointer)0x0;
    cc.value._M_string_length._0_1_ = 0;
    std::__cxx11::string::_M_assign((string *)local_88);
    sVar9 = index_1;
    cc.outerScopeCount = index;
    lVar3 = *(long *)(index_1 + 0x128);
    lVar4 = *(long *)(lVar3 + 0x18);
    lVar5 = *(long *)(lVar3 + 0x20);
    cc.value.field_2._8_8_ = lVar10;
    std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::push_back
              ((vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_> *)
               (lVar3 + 0x18),(value_type *)local_88);
    emit((CompilerAstWalker *)sVar9,LoadClosure,(lVar5 - lVar4) / 0x30);
    std::__cxx11::string::~string((string *)local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec);
  }
  return;
}

Assistant:

void loadVariable(const std::string& str) noexcept {
    std::size_t index;
    if (this->ec->GetDeclarationIndex(str, index, false)) {
      // it's a local
      this->emit(bytecode::ByteCodeInstruction::LoadLocal, index);
    } else {
      // it's a closure
      std::size_t i = 0;
      for (const auto& cc : this->ec->closures) {
        if (cc.value == str) {
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, i);
          return;
        }
        i++;
      }
      // if we've gotten to this point, we need to add a new closure
      std::size_t localOffsets = 1;
      auto ec = this->ec->outerContext;

      while (true) {
        Error::assertWithPanic(ec != nullptr, "Emission context was nullptr when we expected one in resolving closure");
        std::size_t index;
        if (ec->GetDeclarationIndex(str, index, true)) {
          ClosureContext cc;
          cc.value = str;
          cc.outerScopeCount = localOffsets;
          cc.localScopeIndex = index;
          std::size_t closureIndex = this->ec->closures.size();
          this->ec->closures.push_back(cc);
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, closureIndex);
          return;
        }
        ec = ec->outerContext;
        localOffsets++;
      }
    }
  }